

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPSHandler.h
# Opt level: O3

void __thiscall
HTTPSHandler<Client>::
handle<boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>>
          (HTTPSHandler<Client> *this,Client *client,
          request<boost::beast::http::basic_string_body<char>,_http::basic_fields<allocator<char>_>_>
          *request)

{
  pointer pcVar1;
  error_code ec_00;
  error_code ec_01;
  error_code ec_02;
  char *pcVar2;
  ostream *poVar3;
  socket *psVar4;
  int iVar5;
  error_code ec_03;
  bool close;
  error_code ec;
  ssl_stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_&>
  stream;
  request<http::string_body> req;
  string host;
  string cert_path;
  context ctx;
  flat_buffer buffer;
  send_lambda<boost::beast::ssl_stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_&>_>
  lambda;
  bool local_181;
  error_code local_180;
  _Head_base<0UL,_boost::beast::flat_stream<boost::asio::ssl::stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_&>_>_*,_false>
  local_170;
  HTTPSHandler<Client> *local_168;
  undefined4 local_15c;
  undefined1 local_150 [32];
  undefined8 uStack_130;
  list_node<void_*> local_128;
  char *local_118;
  size_t sStack_110;
  char *local_108;
  size_t sStack_100;
  undefined8 local_f8;
  _Alloc_hider local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  string local_d0;
  undefined1 local_b0 [32];
  context local_90;
  basic_flat_buffer<std::allocator<char>_> local_78;
  send_lambda<boost::beast::ssl_stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_&>_>
  local_48;
  
  local_168 = this;
  parse_host<boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>>
            (&local_d0,request);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Host: ",6);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_d0._M_dataplus._M_p,local_d0._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"---------------request----------------",0x26);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  poVar3 = boost::beast::http::operator<<((ostream *)&std::cout,request);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"--------------------------------------",0x26);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  local_180.val_ = 0;
  local_180._4_4_ = local_180._4_4_ & 0xffffff00;
  local_180.cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  psVar4 = Client::get_socket(client);
  pcVar2 = local_150 + 0x10;
  local_150._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_150,
             "HTTP/1.0 200 Connection established\r\nProxy-agent: node.js-proxy\r\n\r\n","");
  local_b0._0_8_ = &local_78;
  local_78.begin_ = (char *)local_150._0_8_;
  local_78.in_ = (char *)local_150._8_8_;
  boost::asio::detail::
  write_buffer_sequence<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::const_buffers_1,boost::asio::const_buffer_const*,boost::asio::detail::transfer_all_t>
            (psVar4,local_b0._0_8_,local_b0,&local_180);
  if ((char *)local_150._0_8_ != pcVar2) {
    operator_delete((void *)local_150._0_8_,(ulong)(local_150._16_8_ + 1));
  }
  if (local_180.failed_ == true) {
    ec_00.failed_ = local_180.failed_;
    ec_00._5_3_ = local_180._5_3_;
    ec_00.val_ = local_180.val_;
    ec_00.cat_ = local_180.cat_;
    fail(ec_00,"init-write");
  }
  else {
    pcVar1 = (local_168->main_dirpath)._M_pathname._M_dataplus._M_p;
    local_150._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_150,pcVar1,
               pcVar1 + (local_168->main_dirpath)._M_pathname._M_string_length);
    generate_cert((string *)local_b0,&local_d0,(string *)local_150);
    if ((char *)local_150._0_8_ != pcVar2) {
      operator_delete((void *)local_150._0_8_,(ulong)(local_150._16_8_ + 1));
    }
    boost::asio::ssl::context::context(&local_90,tlsv12);
    local_15c = 0x65;
    pcVar1 = (local_168->main_dirpath)._M_pathname._M_dataplus._M_p;
    local_150._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_150,pcVar1,
               pcVar1 + (local_168->main_dirpath)._M_pathname._M_string_length);
    load_server_certificate(&local_90,(string *)local_b0,(string *)local_150);
    if ((char *)local_150._0_8_ != pcVar2) {
      operator_delete((void *)local_150._0_8_,(ulong)(local_150._16_8_ + 1));
    }
    psVar4 = Client::get_socket(client);
    boost::beast::
    ssl_stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>&>
    ::
    ssl_stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>&>
              ((ssl_stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>&>
                *)&local_170,psVar4,&local_90);
    local_150._0_4_ = 1;
    boost::asio::ssl::detail::
    io<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::ssl::detail::handshake_op>
              (((local_170._M_head_impl)->stream_).next_layer_,
               &((local_170._M_head_impl)->stream_).core_,(handshake_op *)local_150,&local_180);
    if (local_180.failed_ == true) {
      ec_01.failed_ = local_180.failed_;
      ec_01._5_3_ = local_180._5_3_;
      ec_01.val_ = local_180.val_;
      ec_01.cat_ = local_180.cat_;
      fail(ec_01,"handshake");
    }
    else {
      local_48.close_ = &local_181;
      local_181 = false;
      local_78.out_ = (char *)0x0;
      local_78.last_ = (char *)0x0;
      local_78.begin_ = (char *)0x0;
      local_78.in_ = (char *)0x0;
      local_78.end_ = (char *)0x0;
      local_78.max_ = 0x7fffffffffffffff;
      local_48.stream_ =
           (ssl_stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_&>
            *)&local_170;
      local_48.ec_ = &local_180;
      do {
        uStack_130._0_4_ = red_t;
        uStack_130._4_4_ = 0;
        local_150._8_8_ = (node_ptr)0x0;
        local_150._0_8_ = (char *)0x0;
        local_108 = (char *)0x0;
        sStack_100 = 0;
        local_118 = (char *)0x0;
        sStack_110 = 0;
        local_f8._0_4_ = 0xb;
        local_f8._4_4_ = unknown;
        local_e8 = 0;
        local_e0._M_local_buf[0] = '\0';
        local_150._16_8_ = local_150 + 8;
        local_150._24_8_ = local_150 + 8;
        local_128.next_ = &local_128;
        local_128.prev_ = &local_128;
        local_f0._M_p = (pointer)&local_e0;
        boost::beast::http::
        read<boost::beast::ssl_stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>&>,boost::beast::basic_flat_buffer<std::allocator<char>>,true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>>
                  ((ssl_stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_&>
                    *)&local_170,&local_78,
                   (request<boost::beast::http::basic_string_body<char>,_http::basic_fields<allocator<char>_>_>
                    *)local_150,&local_180);
        iVar5 = 4;
        if (local_180.val_ != 1 ||
            local_180.cat_ !=
            (error_category *)boost::beast::http::make_error_code(boost::beast::http::error)::cat) {
          pcVar2 = "init-read";
          if (local_180.failed_ == false) {
            save_request<boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>>
                      (local_168,
                       (request<boost::beast::http::basic_string_body<char>,_http::basic_fields<allocator<char>_>_>
                        *)local_150);
            send_response<boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>,send_lambda<boost::beast::ssl_stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>&>>&>
                      (local_168,
                       (request<boost::beast::http::basic_string_body<char>,_http::basic_fields<allocator<char>_>_>
                        *)local_150,&local_48);
            if (local_180.failed_ != true) {
              iVar5 = (uint)local_181 << 2;
              goto LAB_001138e6;
            }
            pcVar2 = "init-write";
          }
          iVar5 = 1;
          ec_03.failed_ = local_180.failed_;
          ec_03._5_3_ = local_180._5_3_;
          ec_03.val_ = local_180.val_;
          ec_03.cat_ = local_180.cat_;
          fail(ec_03,pcVar2 + 5);
        }
LAB_001138e6:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_p != &local_e0) {
          operator_delete(local_f0._M_p,
                          CONCAT71(local_e0._M_allocated_capacity._1_7_,local_e0._M_local_buf[0]) +
                          1);
        }
        boost::beast::http::basic_fields<std::allocator<char>_>::~basic_fields
                  ((basic_fields<std::allocator<char>_> *)local_150);
      } while (iVar5 == 0);
      if (iVar5 == 4) {
        boost::asio::ssl::detail::
        io<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::ssl::detail::shutdown_op>
                  (((local_170._M_head_impl)->stream_).next_layer_,
                   &((local_170._M_head_impl)->stream_).core_,(shutdown_op *)local_150,&local_180);
        if (local_180.failed_ == true) {
          ec_02.failed_ = local_180.failed_;
          ec_02._5_3_ = local_180._5_3_;
          ec_02.val_ = local_180.val_;
          ec_02.cat_ = local_180.cat_;
          fail(ec_02,"shutdown");
        }
      }
      if (local_78.begin_ != (char *)0x0) {
        operator_delete(local_78.begin_,(long)local_78.end_ - (long)local_78.begin_);
      }
    }
    std::
    unique_ptr<boost::beast::flat_stream<boost::asio::ssl::stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_&>_>,_std::default_delete<boost::beast::flat_stream<boost::asio::ssl::stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_&>_>_>_>
    ::~unique_ptr((unique_ptr<boost::beast::flat_stream<boost::asio::ssl::stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_&>_>,_std::default_delete<boost::beast::flat_stream<boost::asio::ssl::stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_&>_>_>_>
                   *)&local_170);
    boost::asio::ssl::context::~context(&local_90);
    if ((basic_flat_buffer<std::allocator<char>_> *)local_b0._0_8_ !=
        (basic_flat_buffer<std::allocator<char>_> *)(local_b0 + 0x10)) {
      operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void HTTPSHandler<T>::handle(T&& client, 
                            const http::request<Body, http::basic_fields<Allocator>>& request) {
    std::string host = parse_host(request);

    std::cout << "Host: " << host << std::endl;

    std::cout << "---------------request----------------" << std::endl;
    std::cout << request << std::endl;
    std::cout << "--------------------------------------" << std::endl;

    beast::error_code ec;
    boost::asio::write(
        client.get_socket(), 
        boost::asio::buffer(
            std::string(
                "HTTP/1.0 200 Connection established\r\n"
                "Proxy-agent: node.js-proxy\r\n\r\n"
            )
        ), 
        ec
    );

    if(ec) {
        return fail(ec, "init-write");
    }

    // Generate for each socket individual certificate
    std::string cert_path = generate_cert(host, main_dirpath.string());
    ssl::context ctx{ssl::context::tlsv12};

    int count = 0;
    while (true) {  // We need this to wait cert generate
        try {
            count++;
            load_server_certificate(
                ctx, 
                cert_path,
                main_dirpath.string()
            );
            break;
        } catch (std::exception& e) {
            if (count > CERT_GENERATE_LOAD_LIMIT) {
                std::cerr << "Exception: Certificate load limit" << std::endl;
                throw e;
            }
            std::cerr << "Exception: " << e.what() << std::endl;
            std::this_thread::sleep_for(100ms);
        }
    }

    beast::ssl_stream<tcp::socket&> stream{client.get_socket(), ctx};
    stream.handshake(ssl::stream_base::server, ec);
    if (ec) {
        return fail(ec, "handshake");
    }

    bool close = false;
    beast::flat_buffer buffer;
    send_lambda<beast::ssl_stream<tcp::socket&>> lambda{stream, close, ec};
    for(;;) {
            
        http::request<http::string_body> req;
        http::read(stream, buffer, req, ec);

        if (ec == http::error::end_of_stream) {
            break;
        }
        if (ec) {
            return fail(ec, "read");
        } 

        save_request(req);
        send_response(std::move(req), lambda);

        if (ec) {
            return fail(ec, "write");
        }
        if (close) {
            break;
        }

    }

    stream.shutdown(ec);
    if (ec) {
        return fail(ec, "shutdown");
    }
}